

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ReportInvalidTestSuiteType
               (char *test_suite_name,CodeLocation *code_location)

{
  Message *pMVar1;
  ostream *poVar2;
  int line;
  string local_70;
  string local_50;
  char *local_30;
  char *test_suite_name_local;
  GTestLog local_1c;
  
  local_30 = test_suite_name;
  Message::Message((Message *)&test_suite_name_local);
  std::operator<<((ostream *)(test_suite_name_local + 0x10),"Attempted redefinition of test suite ")
  ;
  pMVar1 = Message::operator<<((Message *)&test_suite_name_local,&local_30);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x275b3e);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [65])
                                      "All tests in the same test suite must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [32])"class.  However, in test suite ");
  pMVar1 = Message::operator<<(pMVar1,&local_30);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [13])0x275854);
  line = 0xadd;
  GTestLog::GTestLog(&local_1c,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O2/tests/googletest-prefix/src/googletest/googletest/src/gtest.cc"
                     ,0xadd);
  FormatFileLocation_abi_cxx11_
            (&local_70,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_70);
  poVar2 = std::operator<<(poVar2," ");
  StringStreamToString(&local_50,(stringstream *)test_suite_name_local);
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  GTestLog::~GTestLog(&local_1c);
  if (test_suite_name_local != (char *)0x0) {
    (**(code **)(*(long *)test_suite_name_local + 8))();
  }
  return;
}

Assistant:

void ReportInvalidTestSuiteType(const char* test_suite_name,
                                CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test suite " << test_suite_name << ".\n"
      << "All tests in the same test suite must use the same test fixture\n"
      << "class.  However, in test suite " << test_suite_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test suites.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}